

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdfcommon.c
# Opt level: O0

FT_16D16 square_root(FT_16D16 val)

{
  ulong uVar1;
  undefined8 local_30;
  FT_ULong r;
  FT_ULong b;
  FT_ULong q;
  FT_ULong t;
  FT_16D16 val_local;
  
  local_30 = (ulong)val;
  b = 0;
  for (r = 0x40000000; 0x40 < r; r = r >> 1) {
    uVar1 = b + r;
    if (uVar1 <= local_30) {
      local_30 = local_30 - uVar1;
      b = uVar1 + r;
    }
    local_30 = local_30 << 1;
  }
  return (FT_16D16)(b >> 8);
}

Assistant:

FT_LOCAL_DEF( FT_16D16 )
  square_root( FT_16D16  val )
  {
    FT_ULong  t, q, b, r;


    r = (FT_ULong)val;
    b = 0x40000000L;
    q = 0;

    while ( b > 0x40L )
    {
      t = q + b;

      if ( r >= t )
      {
        r -= t;
        q  = t + b;
      }

      r <<= 1;
      b >>= 1;
    }

    q >>= 8;

    return (FT_16D16)q;
  }